

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::initializeTables(QPDFWriter *this,size_t extra)

{
  size_t sVar1;
  
  sVar1 = QPDF::tableSize(((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->pdf);
  sVar1 = extra + sVar1 + 100;
  ObjTable<QPDFWriter::Object>::resize
            (&(((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->obj).super_ObjTable<QPDFWriter::Object>,sVar1);
  ObjTable<QPDFWriter::NewObject>::resize
            (&(((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->new_obj).super_ObjTable<QPDFWriter::NewObject>,sVar1);
  return;
}

Assistant:

void
QPDFWriter::initializeTables(size_t extra)
{
    auto size = QIntC::to_size(QPDF::Writer::tableSize(m->pdf) + 100) + extra;
    m->obj.resize(size);
    m->new_obj.resize(size);
}